

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  *local_de8;
  _Self local_dd8;
  _Self local_dd0;
  const_iterator itr;
  ShellPathNode *local_dc0;
  CompileLanguageNode *local_db8;
  CompileLanguageAndIdNode *local_db0;
  LinkOnlyNode *local_da8;
  JoinNode *local_da0;
  InstallPrefixNode *local_d98;
  ZeroNode *local_d90;
  OneNode *local_d88;
  GenexEvalNode *local_d80;
  TargetGenexEvalNode *local_d78;
  TargetNameIfExistsNode *local_d70;
  TargetExistsNode *local_d68;
  TargetPolicyNode *local_d60;
  TargetObjectsNode *local_d58;
  TargetNameNode *local_d50;
  TargetPropertyNode *local_d48;
  CharacterNode<___> *local_d40;
  CharacterNode<_,_> *local_d38;
  CharacterNode<_>_> *local_d30;
  IfNode *local_d28;
  BoolNode *local_d20;
  MakeCIdentifierNode *local_d18;
  UpperCaseNode *local_d10;
  LowerCaseNode *local_d08;
  RemoveDuplicatesNode *local_d00;
  FilterNode *local_cf8;
  InListNode *local_cf0;
  EqualNode *local_ce8;
  StrEqualNode *local_ce0;
  TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag> *local_cd8;
  TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *local_cd0;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag> *local_cc8;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag> *local_cc0;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag> *local_cb8;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *local_cb0;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag> *local_ca8;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *local_ca0;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag> *local_c98;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag> *local_c90;
  TargetFileArtifact<ArtifactLinkerFileSuffixTag> *local_c88;
  TargetFileArtifact<ArtifactFileSuffixTag> *local_c80;
  TargetFileArtifact<ArtifactLinkerFilePrefixTag> *local_c78;
  TargetFileArtifact<ArtifactFilePrefixTag> *local_c70;
  TargetFileBaseNameArtifact<ArtifactPdbTag> *local_c68;
  TargetFileBaseNameArtifact<ArtifactLinkerTag> *local_c60;
  TargetFileBaseNameArtifact<ArtifactNameTag> *local_c58;
  TargetFilesystemArtifactNodeGroup<ArtifactPdbTag> *local_c50;
  TargetFilesystemArtifactNodeGroup<ArtifactSonameTag> *local_c48;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerTag> *local_c40;
  TargetFilesystemArtifactNodeGroup<ArtifactNameTag> *local_c38;
  ConfigurationTestNode *local_c30;
  ConfigurationNode *local_c28;
  CompileFeaturesNode *local_c20;
  PlatformIdNode *local_c18;
  CompilerVersionNode *local_c10;
  CompilerVersionNode *local_c08;
  CompilerVersionNode *local_c00;
  CompilerVersionNode *local_bf8;
  VersionNode<(cmSystemTools::CompareOp)1> *local_bf0;
  VersionNode<(cmSystemTools::CompareOp)3> *local_be8;
  VersionNode<(cmSystemTools::CompareOp)2> *local_be0;
  VersionNode<(cmSystemTools::CompareOp)5> *local_bd8;
  VersionNode<(cmSystemTools::CompareOp)4> *local_bd0;
  CompilerIdNode *local_bc8;
  CompilerIdNode *local_bc0;
  CompilerIdNode *local_bb8;
  CompilerIdNode *local_bb0;
  NotNode *local_ba8;
  BooleanOpNode *local_ba0;
  BooleanOpNode *local_b98;
  OneNode *local_b90 [3];
  ZeroNode *local_b78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  *local_b70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_af0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ac8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_aa0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_988;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_960;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_938;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_910;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_898;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_870;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_848;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_820;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_780;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_758;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_730;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_708;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_690;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_668;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_640;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_618;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_550;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_528;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_500;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_488;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_438;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_410;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_398;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *identifier_local;
  
  local_18 = (undefined1  [8])identifier;
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    if (iVar2 != 0) {
      local_b70 = &local_b68;
      local_b78 = &zeroNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_ZeroNode_*,_true>(local_b70,(char (*) [2])0x982aca,&local_b78)
      ;
      local_b70 = &local_b40;
      local_b90[0] = &oneNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_OneNode_*,_true>(local_b70,(char (*) [2])0x97b9a8,local_b90);
      local_b70 = &local_b18;
      local_b98 = &andNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_BooleanOpNode_*,_true>
                (local_b70,(char (*) [4])0x939edd,&local_b98);
      local_b70 = &local_af0;
      local_ba0 = &orNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_BooleanOpNode_*,_true>
                (local_b70,(char (*) [3])0x98f6d3,&local_ba0);
      local_b70 = &local_ac8;
      local_ba8 = &notNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_NotNode_*,_true>(local_b70,(char (*) [4])0x959d97,&local_ba8);
      local_b70 = &local_aa0;
      local_bb0 = &cCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_CompilerIdNode_*,_true>
                (local_b70,(char (*) [14])0x94f785,&local_bb0);
      local_b70 = &local_a78;
      local_bb8 = &cxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (local_b70,(char (*) [16])0x94f76f,&local_bb8);
      local_b70 = &local_a50;
      local_bc0 = &cudaCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (local_b70,(char (*) [17])"CUDA_COMPILER_ID",&local_bc0);
      local_b70 = &local_a28;
      local_bc8 = &fortranCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompilerIdNode_*,_true>
                (local_b70,(char (*) [20])0x94f799,&local_bc8);
      local_b70 = &local_a00;
      local_bd0 = &versionGreaterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_VersionNode<(cmSystemTools::CompareOp)4>_*,_true>
                (local_b70,(char (*) [16])"VERSION_GREATER",&local_bd0);
      local_b70 = &local_9d8;
      local_bd8 = &versionGreaterEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_VersionNode<(cmSystemTools::CompareOp)5>_*,_true>
                (local_b70,(char (*) [22])"VERSION_GREATER_EQUAL",&local_bd8);
      local_b70 = &local_9b0;
      local_be0 = &versionLessNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_VersionNode<(cmSystemTools::CompareOp)2>_*,_true>
                (local_b70,(char (*) [13])"VERSION_LESS",&local_be0);
      local_b70 = &local_988;
      local_be8 = &versionLessEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_VersionNode<(cmSystemTools::CompareOp)3>_*,_true>
                (local_b70,(char (*) [19])"VERSION_LESS_EQUAL",&local_be8);
      local_b70 = &local_960;
      local_bf0 = &versionEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_VersionNode<(cmSystemTools::CompareOp)1>_*,_true>
                (local_b70,(char (*) [14])"VERSION_EQUAL",&local_bf0);
      local_b70 = &local_938;
      local_bf8 = &cCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerVersionNode_*,_true>
                (local_b70,(char (*) [19])"C_COMPILER_VERSION",&local_bf8);
      local_b70 = &local_910;
      local_c00 = &cxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (local_b70,(char (*) [21])"CXX_COMPILER_VERSION",&local_c00);
      local_b70 = &local_8e8;
      local_c08 = &cudaCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (local_b70,(char (*) [22])"CUDA_COMPILER_VERSION",&local_c08);
      local_b70 = &local_8c0;
      local_c10 = &fortranCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[25],_const_CompilerVersionNode_*,_true>
                (local_b70,(char (*) [25])"Fortran_COMPILER_VERSION",&local_c10);
      local_b70 = &local_898;
      local_c18 = &platformIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_PlatformIdNode_*,_true>
                (local_b70,(char (*) [12])"PLATFORM_ID",&local_c18);
      local_b70 = &local_870;
      local_c20 = &compileFeaturesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileFeaturesNode_*,_true>
                (local_b70,(char (*) [17])0x92e17f,&local_c20);
      local_b70 = &local_848;
      local_c28 = &configurationNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_ConfigurationNode_*,_true>
                (local_b70,(char (*) [14])0x9261b2,&local_c28);
      local_b70 = &local_820;
      local_c30 = &configurationTestNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_ConfigurationTestNode_*,_true>
                (local_b70,(char (*) [7])0x936262,&local_c30);
      local_b70 = &local_7f8;
      local_c38 = &targetNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[12],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag>_*,_true>
                (local_b70,(char (*) [12])0x949dd8,
                 (TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag> **)&local_c38);
      local_b70 = &local_7d0;
      local_c40 = &targetLinkerNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag>_*,_true>
                (local_b70,(char (*) [19])"TARGET_LINKER_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag> **)&local_c40);
      local_b70 = &local_7a8;
      local_c48 = &targetSoNameNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>_*,_true>
                (local_b70,(char (*) [19])"TARGET_SONAME_FILE",
                 (TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> **)&local_c48);
      local_b70 = &local_780;
      local_c50 = &targetPdbNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag>_*,_true>
                (local_b70,(char (*) [16])"TARGET_PDB_FILE",
                 (TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag> **)&local_c50);
      local_b70 = &local_758;
      local_c58 = &targetFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetFileBaseNameArtifact<ArtifactNameTag>_*,_true>
                (local_b70,(char (*) [22])"TARGET_FILE_BASE_NAME",&local_c58);
      local_b70 = &local_730;
      local_c60 = &targetLinkerFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[29],_const_TargetFileBaseNameArtifact<ArtifactLinkerTag>_*,_true>
                (local_b70,(char (*) [29])"TARGET_LINKER_FILE_BASE_NAME",&local_c60);
      local_b70 = &local_708;
      local_c68 = &targetPdbFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileBaseNameArtifact<ArtifactPdbTag>_*,_true>
                (local_b70,(char (*) [26])"TARGET_PDB_FILE_BASE_NAME",&local_c68);
      local_b70 = &local_6e0;
      local_c70 = &targetFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFilePrefixTag>_*,_true>
                (local_b70,(char (*) [19])"TARGET_FILE_PREFIX",&local_c70);
      local_b70 = &local_6b8;
      local_c78 = &targetLinkerFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFilePrefixTag>_*,_true>
                (local_b70,(char (*) [26])"TARGET_LINKER_FILE_PREFIX",&local_c78);
      local_b70 = &local_690;
      local_c80 = &targetFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFileSuffixTag>_*,_true>
                (local_b70,(char (*) [19])"TARGET_FILE_SUFFIX",&local_c80);
      local_b70 = &local_668;
      local_c88 = &targetLinkerFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFileSuffixTag>_*,_true>
                (local_b70,(char (*) [26])"TARGET_LINKER_FILE_SUFFIX",&local_c88);
      local_b70 = &local_640;
      local_c90 = &targetNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[17],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag>_*,_true>
                (local_b70,(char (*) [17])"TARGET_FILE_NAME",&local_c90);
      local_b70 = &local_618;
      local_c98 = &targetLinkerNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag>_*,_true>
                (local_b70,(char (*) [24])"TARGET_LINKER_FILE_NAME",&local_c98);
      local_b70 = &local_5f0;
      local_ca0 = &targetSoNameNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag>_*,_true>
                (local_b70,(char (*) [24])"TARGET_SONAME_FILE_NAME",&local_ca0);
      local_b70 = &local_5c8;
      local_ca8 = &targetPdbNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[21],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag>_*,_true>
                (local_b70,(char (*) [21])"TARGET_PDB_FILE_NAME",&local_ca8);
      local_b70 = &local_5a0;
      local_cb0 = &targetNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>_*,_true>
                (local_b70,(char (*) [16])"TARGET_FILE_DIR",&local_cb0);
      local_b70 = &local_578;
      local_cb8 = &targetLinkerNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag>_*,_true>
                (local_b70,(char (*) [23])"TARGET_LINKER_FILE_DIR",&local_cb8);
      local_b70 = &local_550;
      local_cc0 = &targetSoNameNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag>_*,_true>
                (local_b70,(char (*) [23])"TARGET_SONAME_FILE_DIR",&local_cc0);
      local_b70 = &local_528;
      local_cc8 = &targetPdbNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[20],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag>_*,_true>
                (local_b70,(char (*) [20])"TARGET_PDB_FILE_DIR",&local_cc8);
      local_b70 = &local_500;
      local_cd0 = &targetBundleDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[18],_const_TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag>_*,_true>
                (local_b70,(char (*) [18])"TARGET_BUNDLE_DIR",&local_cd0);
      local_b70 = &local_4d8;
      local_cd8 = &targetBundleContentDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag>_*,_true>
                (local_b70,(char (*) [26])"TARGET_BUNDLE_CONTENT_DIR",&local_cd8);
      local_b70 = &local_4b0;
      local_ce0 = &strEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[9],_const_StrEqualNode_*,_true>
                (local_b70,(char (*) [9])"STREQUAL",&local_ce0);
      local_b70 = &local_488;
      local_ce8 = &equalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_EqualNode_*,_true>
                (local_b70,(char (*) [6])0x9576bd,&local_ce8);
      local_b70 = &local_460;
      local_cf0 = &inListNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_InListNode_*,_true>
                (local_b70,(char (*) [8])"IN_LIST",&local_cf0);
      local_b70 = &local_438;
      local_cf8 = &filterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_FilterNode_*,_true>
                (local_b70,(char (*) [7])"FILTER",&local_cf8);
      local_b70 = &local_410;
      local_d00 = &removeDuplicatesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_RemoveDuplicatesNode_*,_true>
                (local_b70,(char (*) [18])"REMOVE_DUPLICATES",&local_d00);
      local_b70 = &local_3e8;
      local_d08 = &lowerCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LowerCaseNode_*,_true>
                (local_b70,(char (*) [11])"LOWER_CASE",&local_d08);
      local_b70 = &local_3c0;
      local_d10 = &upperCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_UpperCaseNode_*,_true>
                (local_b70,(char (*) [11])"UPPER_CASE",&local_d10);
      local_b70 = &local_398;
      local_d18 = &makeCIdentifierNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_MakeCIdentifierNode_*,_true>
                (local_b70,(char (*) [18])"MAKE_C_IDENTIFIER",&local_d18);
      local_b70 = &local_370;
      local_d20 = &boolNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_BoolNode_*,_true>(local_b70,(char (*) [5])0x93681c,&local_d20)
      ;
      local_b70 = &local_348;
      local_d28 = &ifNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_IfNode_*,_true>(local_b70,(char (*) [3])0x94ac94,&local_d28);
      local_b70 = &local_320;
      local_d30 = &angle_rNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_CharacterNode<_>_>____true>
                (local_b70,(char (*) [8])"ANGLE-R",&local_d30);
      local_b70 = &local_2f8;
      local_d38 = &commaNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_CharacterNode<_,_>_*,_true>
                (local_b70,(char (*) [6])"COMMA",&local_d38);
      local_b70 = &local_2d0;
      local_d40 = &semicolonNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_CharacterNode<___>_*,_true>
                (local_b70,(char (*) [10])"SEMICOLON",&local_d40);
      local_b70 = &local_2a8;
      local_d48 = &targetPropertyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_TargetPropertyNode_*,_true>
                (local_b70,(char (*) [16])"TARGET_PROPERTY",&local_d48);
      local_b70 = &local_280;
      local_d50 = &targetNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_TargetNameNode_*,_true>
                (local_b70,(char (*) [12])0x93141b,&local_d50);
      local_b70 = &local_258;
      local_d58 = &targetObjectsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_TargetObjectsNode_*,_true>
                (local_b70,(char (*) [15])"TARGET_OBJECTS",&local_d58);
      local_b70 = &local_230;
      local_d60 = &targetPolicyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetPolicyNode_*,_true>
                (local_b70,(char (*) [14])"TARGET_POLICY",&local_d60);
      local_b70 = &local_208;
      local_d68 = &targetExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetExistsNode_*,_true>
                (local_b70,(char (*) [14])"TARGET_EXISTS",&local_d68);
      local_b70 = &local_1e0;
      local_d70 = &targetNameIfExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetNameIfExistsNode_*,_true>
                (local_b70,(char (*) [22])"TARGET_NAME_IF_EXISTS",&local_d70);
      local_b70 = &local_1b8;
      local_d78 = &targetGenexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_TargetGenexEvalNode_*,_true>
                (local_b70,(char (*) [18])"TARGET_GENEX_EVAL",&local_d78);
      local_b70 = &local_190;
      local_d80 = &genexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_GenexEvalNode_*,_true>
                (local_b70,(char (*) [11])0x95c840,&local_d80);
      local_b70 = &local_168;
      local_d88 = &buildInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_OneNode_*,_true>
                (local_b70,(char (*) [16])"BUILD_INTERFACE",&local_d88);
      local_b70 = &local_140;
      local_d90 = &installInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_ZeroNode_*,_true>
                (local_b70,(char (*) [18])"INSTALL_INTERFACE",&local_d90);
      local_b70 = &local_118;
      local_d98 = &installPrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_InstallPrefixNode_*,_true>
                (local_b70,(char (*) [15])0x92a5d9,&local_d98);
      local_b70 = &local_f0;
      local_da0 = &joinNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_JoinNode_*,_true>(local_b70,(char (*) [5])"JOIN",&local_da0);
      local_b70 = &local_c8;
      local_da8 = &linkOnlyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_LinkOnlyNode_*,_true>
                (local_b70,(char (*) [10])0x942046,&local_da8);
      local_b70 = &local_a0;
      local_db0 = &languageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompileLanguageAndIdNode_*,_true>
                (local_b70,(char (*) [20])"COMPILE_LANG_AND_ID",&local_db0);
      local_b70 = &local_78;
      local_db8 = &languageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileLanguageNode_*,_true>
                (local_b70,(char (*) [17])"COMPILE_LANGUAGE",&local_db8);
      local_b70 = &local_50;
      local_dc0 = &shellPathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_ShellPathNode_*,_true>
                (local_b70,(char (*) [11])"SHELL_PATH",&local_dc0);
      local_28 = &local_b68;
      local_20 = 0x48;
      this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
              *)((long)&itr._M_node + 6);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
      ::allocator(this);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
      ::map(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&itr._M_node + 7),this);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
                    *)((long)&itr._M_node + 6));
      local_de8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
                   *)&local_28;
      do {
        local_de8 = local_de8 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
        ::~pair(local_de8);
      } while (local_de8 != &local_b68);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                   ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    }
  }
  local_dd0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
       ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,(key_type *)local_18);
  local_dd8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
       ::end(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
  bVar1 = std::operator!=(&local_dd0,&local_dd8);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
             ::operator->(&local_dd0);
    identifier_local = (string *)ppVar3->second;
  }
  else {
    identifier_local = (string *)0x0;
  }
  return (cmGeneratorExpressionNode *)identifier_local;
}

Assistant:

const cmGeneratorExpressionNode* cmGeneratorExpressionNode::GetNode(
  const std::string& identifier)
{
  static std::map<std::string, cmGeneratorExpressionNode const*> const nodeMap{
    { "0", &zeroNode },
    { "1", &oneNode },
    { "AND", &andNode },
    { "OR", &orNode },
    { "NOT", &notNode },
    { "C_COMPILER_ID", &cCompilerIdNode },
    { "CXX_COMPILER_ID", &cxxCompilerIdNode },
    { "CUDA_COMPILER_ID", &cudaCompilerIdNode },
    { "Fortran_COMPILER_ID", &fortranCompilerIdNode },
    { "VERSION_GREATER", &versionGreaterNode },
    { "VERSION_GREATER_EQUAL", &versionGreaterEqNode },
    { "VERSION_LESS", &versionLessNode },
    { "VERSION_LESS_EQUAL", &versionLessEqNode },
    { "VERSION_EQUAL", &versionEqualNode },
    { "C_COMPILER_VERSION", &cCompilerVersionNode },
    { "CXX_COMPILER_VERSION", &cxxCompilerVersionNode },
    { "CUDA_COMPILER_VERSION", &cudaCompilerVersionNode },
    { "Fortran_COMPILER_VERSION", &fortranCompilerVersionNode },
    { "PLATFORM_ID", &platformIdNode },
    { "COMPILE_FEATURES", &compileFeaturesNode },
    { "CONFIGURATION", &configurationNode },
    { "CONFIG", &configurationTestNode },
    { "TARGET_FILE", &targetNodeGroup.File },
    { "TARGET_LINKER_FILE", &targetLinkerNodeGroup.File },
    { "TARGET_SONAME_FILE", &targetSoNameNodeGroup.File },
    { "TARGET_PDB_FILE", &targetPdbNodeGroup.File },
    { "TARGET_FILE_BASE_NAME", &targetFileBaseNameNode },
    { "TARGET_LINKER_FILE_BASE_NAME", &targetLinkerFileBaseNameNode },
    { "TARGET_PDB_FILE_BASE_NAME", &targetPdbFileBaseNameNode },
    { "TARGET_FILE_PREFIX", &targetFilePrefixNode },
    { "TARGET_LINKER_FILE_PREFIX", &targetLinkerFilePrefixNode },
    { "TARGET_FILE_SUFFIX", &targetFileSuffixNode },
    { "TARGET_LINKER_FILE_SUFFIX", &targetLinkerFileSuffixNode },
    { "TARGET_FILE_NAME", &targetNodeGroup.FileName },
    { "TARGET_LINKER_FILE_NAME", &targetLinkerNodeGroup.FileName },
    { "TARGET_SONAME_FILE_NAME", &targetSoNameNodeGroup.FileName },
    { "TARGET_PDB_FILE_NAME", &targetPdbNodeGroup.FileName },
    { "TARGET_FILE_DIR", &targetNodeGroup.FileDir },
    { "TARGET_LINKER_FILE_DIR", &targetLinkerNodeGroup.FileDir },
    { "TARGET_SONAME_FILE_DIR", &targetSoNameNodeGroup.FileDir },
    { "TARGET_PDB_FILE_DIR", &targetPdbNodeGroup.FileDir },
    { "TARGET_BUNDLE_DIR", &targetBundleDirNode },
    { "TARGET_BUNDLE_CONTENT_DIR", &targetBundleContentDirNode },
    { "STREQUAL", &strEqualNode },
    { "EQUAL", &equalNode },
    { "IN_LIST", &inListNode },
    { "FILTER", &filterNode },
    { "REMOVE_DUPLICATES", &removeDuplicatesNode },
    { "LOWER_CASE", &lowerCaseNode },
    { "UPPER_CASE", &upperCaseNode },
    { "MAKE_C_IDENTIFIER", &makeCIdentifierNode },
    { "BOOL", &boolNode },
    { "IF", &ifNode },
    { "ANGLE-R", &angle_rNode },
    { "COMMA", &commaNode },
    { "SEMICOLON", &semicolonNode },
    { "TARGET_PROPERTY", &targetPropertyNode },
    { "TARGET_NAME", &targetNameNode },
    { "TARGET_OBJECTS", &targetObjectsNode },
    { "TARGET_POLICY", &targetPolicyNode },
    { "TARGET_EXISTS", &targetExistsNode },
    { "TARGET_NAME_IF_EXISTS", &targetNameIfExistsNode },
    { "TARGET_GENEX_EVAL", &targetGenexEvalNode },
    { "GENEX_EVAL", &genexEvalNode },
    { "BUILD_INTERFACE", &buildInterfaceNode },
    { "INSTALL_INTERFACE", &installInterfaceNode },
    { "INSTALL_PREFIX", &installPrefixNode },
    { "JOIN", &joinNode },
    { "LINK_ONLY", &linkOnlyNode },
    { "COMPILE_LANG_AND_ID", &languageAndIdNode },
    { "COMPILE_LANGUAGE", &languageNode },
    { "SHELL_PATH", &shellPathNode }
  };

  {
    auto itr = nodeMap.find(identifier);
    if (itr != nodeMap.end()) {
      return itr->second;
    }
  }
  return nullptr;
}